

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

QString * __thiscall QLocale::toUpper(QString *__return_storage_ptr__,QLocale *this,QString *str)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  long in_FS_OFFSET;
  bool ok;
  QArrayDataPointer<char16_t> local_48;
  bool local_21;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_21 = true;
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QLocalePrivate::toUpper((QString *)&local_48,(this->d).d.ptr,str,&local_21);
  qVar3 = local_48.size;
  pcVar2 = local_48.ptr;
  pDVar1 = local_48.d;
  if (local_21 == true) {
    local_48.d = (Data *)0x0;
    local_48.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = pcVar2;
    local_48.size = 0;
    (__return_storage_ptr__->d).size = qVar3;
  }
  else {
    QString::toUpper_helper(__return_storage_ptr__,str);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QLocale::toUpper(const QString &str) const
{
#if !defined(QT_BOOTSTRAPPED) && (QT_CONFIG(icu) || defined(Q_OS_WIN) || defined(Q_OS_APPLE))
    bool ok = true;
    QString result = d->toUpper(str, &ok);
    if (ok)
        return result;
    // else fall through and use Qt's toUpper
#endif
    return str.toUpper();
}